

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall asl::InetAddress::InetAddress(InetAddress *this,Type t)

{
  uchar *__s;
  uint m;
  
  m = 0;
  Array<unsigned_char>::alloc(&this->_data,0);
  this->_type = t;
  if (t - IPv4 < 3) {
    m = *(uint *)(&DAT_00140164 + (ulong)(t - IPv4) * 4);
  }
  Array<unsigned_char>::reserve(&this->_data,m);
  __s = (this->_data)._a;
  *(uint *)(__s + -0x10) = m;
  memset(__s,0,(ulong)m);
  return;
}

Assistant:

InetAddress::InetAddress(InetAddress::Type t)
{
	_type = t;
	int n = 0;
	switch (t)
	{
	case IPv4: n = sizeof(sockaddr_in); break;
	case IPv6: n = sizeof(sockaddr_in6); break;
#ifdef ASL_SOCKET_LOCAL
	case LOCAL: n = sizeof(sockaddr_un); break;
#endif
	default: ;
	}
	resize(n);
	memset(ptr(), 0, n);
}